

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strrchr_63(UChar *s,UChar c)

{
  UChar *pUStack_28;
  UChar cs;
  UChar *result;
  UChar *pUStack_18;
  UChar c_local;
  UChar *s_local;
  
  pUStack_18 = s;
  if ((c & 0xf800U) == 0xd800) {
    result._6_2_ = c;
    s_local = u_strFindLast_63(s,-1,(UChar *)((long)&result + 6),1);
  }
  else {
    pUStack_28 = (UChar *)0x0;
    while( true ) {
      if (*pUStack_18 == c) {
        pUStack_28 = pUStack_18;
      }
      if (*pUStack_18 == L'\0') break;
      pUStack_18 = pUStack_18 + 1;
    }
    s_local = pUStack_28;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strrchr(const UChar *s, UChar c) {
    if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindLast(s, -1, &c, 1);
    } else {
        const UChar *result=NULL;
        UChar cs;

        /* trivial search for a BMP code point */
        for(;;) {
            if((cs=*s)==c) {
                result=s;
            }
            if(cs==0) {
                return (UChar *)result;
            }
            ++s;
        }
    }
}